

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etw.cpp
# Opt level: O3

void writeEtw(QFile *file,Provider *provider)

{
  int *piVar1;
  Tracepoint *pTVar2;
  uint i;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  uint i_00;
  char16_t *pcVar8;
  undefined4 i_01;
  undefined1 auVar9 [8];
  Data *pDVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  QTextStream *pQVar14;
  char *pcVar15;
  TraceEnum *pTVar16;
  TraceFlags *pTVar17;
  Field *pFVar18;
  uint i_02;
  ulong uVar19;
  TraceFlags *flag;
  TraceFlags *name;
  const_iterator __begin0;
  EnumValue *args;
  EnumValue *pEVar20;
  EnumValue *v;
  long lVar21;
  quint64 qVar22;
  EnumValue *pEVar23;
  FlagValue *pFVar24;
  Field *pFVar25;
  uint uVar26;
  size_t sVar27;
  ulong uVar28;
  TraceEnum *name_00;
  long lVar29;
  qsizetype qVar30;
  FlagValue *pFVar31;
  Tracepoint *string;
  QString *pQVar32;
  int iVar33;
  EnumValue *v_1;
  long in_FS_OFFSET;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QTextStream stream;
  QString guid;
  QTextStream stream_1;
  QString local_198;
  QTextStream local_178;
  QString local_170;
  QString local_158;
  QString local_138;
  QString local_118;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  qsizetype local_e8;
  quint64 qStack_e0;
  ulong local_d8;
  uchar auStack_d0 [8];
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined8 uStack_a0;
  QString local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_178.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&local_178,(QIODevice *)file);
  local_198.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_198.d.d._0_4_ = 0xaaaaaaaa;
  local_198.d.d._4_4_ = 0xaaaaaaaa;
  local_198.d.ptr._0_4_ = 0xaaaaaaaa;
  local_198.d.ptr._4_4_ = 0xaaaaaaaa;
  (*(file->super_QFileDevice).super_QIODevice._vptr_QIODevice[0x13])((QString *)local_f8,file);
  QFileInfo::QFileInfo((QFileInfo *)&local_98,(QString *)local_f8);
  QFileInfo::fileName(&local_198,(QFileInfo *)&local_98);
  QFileInfo::~QFileInfo((QFileInfo *)&local_98);
  if (local_f8 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
    }
  }
  writeCommonPrologue(&local_178);
  local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  uStack_f0 = "_provider";
  local_e8 = 9;
  local_f8 = (undefined1  [8])provider;
  QStringBuilder<const_QString_&,_QLatin1StringView>::convertTo<QString>
            (&local_118,(QStringBuilder<const_QString_&,_QLatin1StringView> *)local_f8);
  local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  includeGuard(&local_138,&local_198);
  local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit_helper
            ((QByteArray *)&local_170,(QChar *)(provider->name).d.ptr,(provider->name).d.size);
  qVar30 = local_170.d.size;
  pcVar8 = local_170.d.ptr;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = (undefined1  [8])0xefcdab8967452301;
  uStack_f0 = (char *)0x1032547698badcfe;
  local_e8 = -0x555555553c2d1e10;
  qVar22 = local_170.d.size + 0x10;
  local_d8 = 0;
  auStack_d0[0] = '\0';
  auStack_d0[1] = '\0';
  auStack_d0[2] = '\0';
  auStack_d0[3] = '\0';
  auStack_d0[4] = '\0';
  auStack_d0[5] = '\0';
  auStack_d0[6] = '\0';
  auStack_d0[7] = '\0';
  qStack_e0 = qVar22;
  if ((ulong)local_170.d.size < 0x30) {
    __memcpy_chk(&local_c8,local_170.d.ptr,local_170.d.size,0x30);
    qStack_e0 = qVar22;
  }
  else {
    local_c8 = *(undefined1 **)local_170.d.ptr;
    puStack_c0 = *(undefined1 **)(local_170.d.ptr + 4);
    local_b8 = *(undefined1 **)(local_170.d.ptr + 8);
    puStack_b0 = *(undefined1 **)(local_170.d.ptr + 0xc);
    local_a8 = *(undefined1 **)(local_170.d.ptr + 0x10);
    uStack_a0 = *(undefined1 **)(local_170.d.ptr + 0x14);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    lVar29 = qVar30 - (ulong)((uint)qVar22 & 0x3f);
    lVar21 = 0x30;
    if (0x30 < lVar29) {
      do {
        sha1ProcessChunk((Sha1State *)local_f8,(uchar *)((long)pcVar8 + lVar21));
        lVar21 = lVar21 + 0x40;
      } while (lVar21 < lVar29);
    }
    __memcpy_chk(&local_d8,(long)pcVar8 + lVar21,qVar30 - lVar21,0x40);
  }
  uVar19 = qStack_e0 * 8;
  local_58.d.d = (Data *)(uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                          (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                          (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                          (uVar19 & 0xff00) << 0x28 | qStack_e0 << 0x3b);
  uVar26 = (uint)qStack_e0;
  uVar19 = (ulong)(uVar26 & 0x3f);
  qStack_e0 = qStack_e0 + 1;
  if (uVar19 == 0x3f) {
    uStack_a0 = (undefined1 *)CONCAT17(0x80,(undefined7)uStack_a0);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
  }
  else {
    *(undefined1 *)((long)&local_d8 + uVar19) = 0x80;
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_98.d.size = 0;
  uStack_80 = 0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  uVar26 = uVar26 & 0x3f;
  uVar19 = (ulong)((uint)qStack_e0 & 0x3f);
  if (uVar26 < 0x38) {
    uVar28 = (ulong)(0x37 - uVar26);
    qStack_e0 = qStack_e0 + uVar28;
    if (uVar19 + uVar28 < 0x40) {
      memcpy((uchar *)((long)&local_d8 + uVar19),&local_98,uVar28);
      goto LAB_00106d72;
    }
    sVar27 = -uVar19 + 0x40;
    memcpy((uchar *)((long)&local_d8 + uVar19),&local_98,sVar27);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    if ((long)sVar27 < (long)(uVar28 - ((uint)(uVar19 + uVar28) & 0x3f))) {
      sha1ProcessChunk((Sha1State *)local_f8,(uchar *)((long)&local_58 + -uVar19));
      sVar27 = 0x80 - uVar19;
    }
    lVar29 = uVar28 - sVar27;
  }
  else {
    uVar28 = (ulong)(uVar26 ^ 0x3f);
    qStack_e0 = qStack_e0 + uVar28;
    if (uVar19 + uVar28 < 0x40) {
      memcpy((uchar *)((long)&local_d8 + uVar19),&local_98,uVar28);
    }
    else {
      sVar27 = -uVar19 + 0x40;
      memcpy((uchar *)((long)&local_d8 + uVar19),&local_98,sVar27);
      sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
      if ((long)sVar27 < (long)(uVar28 - ((uint)(uVar19 + uVar28) & 0x3f))) {
        sVar27 = 0x80 - uVar19;
        sha1ProcessChunk((Sha1State *)local_f8,(uchar *)((long)&local_58 + -uVar19));
      }
      __memcpy_chk(&local_d8,(long)&local_98.d.d + sVar27,uVar28 - sVar27,0x40);
    }
    uVar19 = (ulong)((uint)qStack_e0 & 0x3f);
    qVar22 = qStack_e0 + 0x38;
    qStack_e0 = qVar22;
    if (uVar19 < 8) {
      *(undefined8 *)((long)&local_a8 + uVar19) = local_68;
      uVar12 = uStack_70;
      uVar11 = uStack_80;
      qVar30 = local_98.d.size;
      pcVar8 = local_98.d.ptr;
      pDVar10 = local_98.d.d;
      *(undefined8 *)((long)&local_b8 + uVar19) = local_78;
      *(undefined8 *)((long)&puStack_b0 + uVar19) = uVar12;
      *(qsizetype *)((long)&local_c8 + uVar19) = qVar30;
      *(undefined8 *)((long)&puStack_c0 + uVar19) = uVar11;
      *(Data **)((long)&local_d8 + uVar19) = pDVar10;
      *(char16_t **)(auStack_d0 + uVar19) = pcVar8;
      goto LAB_00106d72;
    }
    sVar27 = -uVar19 + 0x40;
    memcpy((uchar *)((long)&local_d8 + uVar19),&local_98,sVar27);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    if ((long)sVar27 < (long)(0x38 - (ulong)((uint)qVar22 & 0x3f))) {
      sVar27 = 0x80 - uVar19;
      sha1ProcessChunk((Sha1State *)local_f8,(uchar *)((long)&local_58 + -uVar19));
    }
    lVar29 = 0x38 - sVar27;
  }
  __memcpy_chk(&local_d8,(long)&local_98.d.d + sVar27,lVar29,0x40);
LAB_00106d72:
  uVar19 = (ulong)((uint)qStack_e0 & 0x3f);
  qVar22 = qStack_e0 + 8;
  if (uVar19 < 0x38) {
    *(Data **)((long)&local_d8 + uVar19) = local_58.d.d;
  }
  else {
    uVar28 = -uVar19 + 0x40;
    qStack_e0 = qVar22;
    memcpy((uchar *)((long)&local_d8 + uVar19),&local_58,uVar28);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    if (uVar28 < 8 - (ulong)((uint)qVar22 & 0x3f)) {
      sha1ProcessChunk((Sha1State *)local_f8,&stack0xffffffffffffffe8 + -uVar19);
      uVar28 = 0x80 - uVar19;
    }
    __memcpy_chk(&local_d8,(long)&local_58.d.d + uVar28,8 - uVar28,0x40);
  }
  auVar9 = local_f8;
  puStack_b0 = (undefined1 *)0x0;
  local_a8 = (undefined1 *)0x0;
  puStack_c0 = (undefined1 *)0x0;
  local_b8 = (undefined1 *)0x0;
  auStack_d0[0] = '\0';
  auStack_d0[1] = '\0';
  auStack_d0[2] = '\0';
  auStack_d0[3] = '\0';
  auStack_d0[4] = '\0';
  auStack_d0[5] = '\0';
  auStack_d0[6] = '\0';
  auStack_d0[7] = '\0';
  local_c8 = (undefined1 *)0x0;
  qStack_e0 = 0;
  local_d8 = 0;
  uStack_a0._0_1_ = '\0';
  uStack_a0._1_1_ = '\0';
  uStack_a0._2_1_ = '\0';
  uStack_a0._3_1_ = '\0';
  uStack_a0._4_1_ = '\0';
  uStack_a0._5_1_ = '\0';
  uStack_a0._6_1_ = '\0';
  uStack_a0._7_1_ = '\0';
  i_01 = local_f8._0_4_;
  uVar7 = local_f8._5_2_;
  iVar33 = local_f8._4_4_ << 0x18;
  uVar26 = (uint)uStack_f0 >> 0x18;
  uVar3 = (uint)uStack_f0 & 0xff0000;
  uVar5 = (uint)uStack_f0 & 0xff00;
  i_02 = (uint)uStack_f0 & 0xff;
  i = uStack_f0._4_4_ >> 0x18;
  uVar4 = uStack_f0._4_4_ & 0xff0000;
  uVar6 = uStack_f0._4_4_ & 0xff00;
  i_00 = uStack_f0._4_4_ & 0xff;
  local_158.d.d = (Data *)0x0;
  local_158.d.ptr = (char16_t *)0x0;
  local_158.d.size = 0;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_98,&local_158,(OpenMode)0x3);
  Qt::hex((QTextStream *)&local_98);
  Qt::showbase((QTextStream *)&local_98);
  pQVar14 = QTextStream::operator<<((QTextStream *)&local_98,"(");
  pQVar14 = QTextStream::operator<<(pQVar14,i_01);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,auVar9._6_2_);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<
                      (pQVar14,(uVar7 & 0xf | 0x50) << 8 | (ushort)((uint)iVar33 >> 0x18));
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,uVar26 & 0x3f | 0x80);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,uVar3 >> 0x10);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,(uVar5 << 8) >> 0x10);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,i_02);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,i);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,uVar4 >> 0x10);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,(uVar6 << 8) >> 0x10);
  pQVar14 = QTextStream::operator<<(pQVar14,", ");
  pQVar14 = QTextStream::operator<<(pQVar14,i_00);
  QTextStream::operator<<(pQVar14,")");
  QTextStream::~QTextStream((QTextStream *)&local_98);
  if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,1,0x10);
    }
  }
  pQVar14 = QTextStream::operator<<(&local_178,"#ifndef ");
  pQVar14 = QTextStream::operator<<(pQVar14,&local_138);
  pQVar14 = QTextStream::operator<<(pQVar14,"\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"#define ");
  pQVar14 = QTextStream::operator<<(pQVar14,&local_138);
  pQVar14 = QTextStream::operator<<(pQVar14,"\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"#include <qt_windows.h>\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"#include <TraceLoggingProvider.h>\n");
  QTextStream::operator<<(pQVar14,"\n");
  QTextStream::operator<<
            (&local_178,
             "#undef _TlgPragmaUtf8Begin\n#undef _TlgPragmaUtf8End\n#define _TlgPragmaUtf8Begin\n#define _TlgPragmaUtf8End\n"
            );
  QTextStream::operator<<(&local_178,"\n");
  pcVar15 = qtHeaders();
  QTextStream::operator<<(&local_178,pcVar15);
  QTextStream::operator<<(&local_178,"\n");
  if ((provider->prefixText).d.size != 0) {
    local_98.d.d = (Data *)CONCAT62(local_98.d.d._2_6_,10);
    QtPrivate::QStringList_join((QString *)local_f8,&provider->prefixText,(QChar *)&local_98,1);
    pQVar14 = QTextStream::operator<<(&local_178,(QString *)local_f8);
    QTextStream::operator<<(pQVar14,"\n\n");
    if (local_f8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_f8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
      }
    }
  }
  pQVar14 = QTextStream::operator<<(&local_178,"#ifdef TRACEPOINT_DEFINE\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"TRACELOGGING_DEFINE_PROVIDER(");
  pQVar14 = QTextStream::operator<<(pQVar14,&local_118);
  pQVar14 = QTextStream::operator<<(pQVar14,", \"");
  pQVar14 = QTextStream::operator<<(pQVar14,&provider->name);
  pQVar14 = QTextStream::operator<<(pQVar14,"\", ");
  pQVar14 = QTextStream::operator<<(pQVar14,&local_158);
  QTextStream::operator<<(pQVar14,");\n\n");
  pQVar14 = QTextStream::operator<<(&local_178,"static inline void registerProvider()\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"{\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"    TraceLoggingRegister(");
  pQVar14 = QTextStream::operator<<(pQVar14,&local_118);
  pQVar14 = QTextStream::operator<<(pQVar14,");\n");
  QTextStream::operator<<(pQVar14,"}\n\n");
  pQVar14 = QTextStream::operator<<(&local_178,"static inline void unregisterProvider()\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"{\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"    TraceLoggingUnregister(");
  pQVar14 = QTextStream::operator<<(pQVar14,&local_118);
  pQVar14 = QTextStream::operator<<(pQVar14,");\n");
  QTextStream::operator<<(pQVar14,"}\n");
  pQVar14 = QTextStream::operator<<(&local_178,"Q_CONSTRUCTOR_FUNCTION(registerProvider)\n");
  QTextStream::operator<<(pQVar14,"Q_DESTRUCTOR_FUNCTION(unregisterProvider)\n\n");
  pQVar14 = QTextStream::operator<<(&local_178,"#else\n");
  pQVar14 = QTextStream::operator<<(pQVar14,"TRACELOGGING_DECLARE_PROVIDER(");
  pQVar14 = QTextStream::operator<<(pQVar14,&local_118);
  pQVar14 = QTextStream::operator<<(pQVar14,");\n");
  QTextStream::operator<<(pQVar14,"#endif // TRACEPOINT_DEFINE\n\n");
  if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((provider->tracepoints).d.size != 0) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = L"TP_%1_PROVIDER";
    local_98.d.size = 0xe;
    a.m_size = (provider->name).d.size * 4 + 2;
    a.field_0.m_data_utf16 = (provider->name).d.ptr;
    QString::arg_impl((QString *)local_f8,&local_98,a,0,(QChar)0x20);
    QString::toUpper_helper(&local_58,(QString *)local_f8);
    if (local_f8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_f8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar14 = QTextStream::operator<<(&local_178,"#if !defined(");
    pQVar14 = QTextStream::operator<<(pQVar14,&local_58);
    pQVar14 = QTextStream::operator<<(pQVar14,") && !defined(TRACEPOINT_DEFINE)\n");
    pQVar14 = QTextStream::operator<<(pQVar14,"#define ");
    pQVar14 = QTextStream::operator<<(pQVar14,&local_58);
    pQVar14 = QTextStream::operator<<(pQVar14,"\n");
    pQVar14 = QTextStream::operator<<(pQVar14,"QT_BEGIN_NAMESPACE\n");
    QTextStream::operator<<(pQVar14,"namespace QtPrivate {\n");
    lVar29 = (provider->enumerations).d.size;
    if (lVar29 != 0) {
      name_00 = (provider->enumerations).d.ptr;
      pTVar16 = name_00 + lVar29;
      do {
        pQVar14 = QTextStream::operator<<(&local_178,"inline QString trace_convert_");
        typeToTypeName((QString *)local_f8,&name_00->name);
        pQVar14 = QTextStream::operator<<(pQVar14,(QString *)local_f8);
        pQVar14 = QTextStream::operator<<(pQVar14,"(");
        pQVar14 = QTextStream::operator<<(pQVar14,&name_00->name);
        QTextStream::operator<<(pQVar14," val)\n");
        if (local_f8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_f8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
          }
        }
        QTextStream::operator<<(&local_178,"{\n");
        lVar29 = (name_00->values).d.size;
        if (lVar29 != 0) {
          pEVar23 = (name_00->values).d.ptr;
          lVar29 = lVar29 << 5;
          do {
            if (pEVar23->range != 0) {
              pQVar14 = QTextStream::operator<<(&local_178,"    if (val >= ");
              pQVar14 = QTextStream::operator<<(pQVar14,pEVar23->value);
              pQVar14 = QTextStream::operator<<(pQVar14," && val <= ");
              pQVar14 = QTextStream::operator<<(pQVar14,pEVar23->range);
              pQVar14 = QTextStream::operator<<(pQVar14,")\n");
              pQVar14 = QTextStream::operator<<(pQVar14,"        return QStringLiteral(\"");
              pQVar14 = QTextStream::operator<<(pQVar14,&pEVar23->name);
              pQVar14 = QTextStream::operator<<(pQVar14," + \") + QString::number((int)val - ");
              pQVar14 = QTextStream::operator<<(pQVar14,pEVar23->value);
              QTextStream::operator<<(pQVar14,");\n");
            }
            pEVar23 = pEVar23 + 1;
            lVar29 = lVar29 + -0x20;
          } while (lVar29 != 0);
        }
        QTextStream::operator<<(&local_178,"\n    QString ret;\n    switch (val) {\n");
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_98.d.size = 0;
        lVar29 = (name_00->values).d.size;
        if (lVar29 != 0) {
          pEVar23 = (name_00->values).d.ptr;
          pEVar20 = pEVar23 + lVar29;
          do {
            if (pEVar23->range == 0) {
              if ((undefined1 *)local_98.d.size != (undefined1 *)0x0) {
                lVar29 = 0;
                do {
                  if (local_98.d.size << 2 == lVar29) goto LAB_001076eb;
                  lVar21 = lVar29 + 4;
                  piVar1 = (int *)((long)local_98.d.ptr + lVar29);
                  lVar29 = lVar21;
                } while (*piVar1 != pEVar23->value);
                if (lVar21 != 0) goto LAB_00107826;
              }
LAB_001076eb:
              pQVar14 = QTextStream::operator<<(&local_178,"    case ");
              pQVar14 = QTextStream::operator<<(pQVar14,pEVar23->value);
              pQVar14 = QTextStream::operator<<(pQVar14,": ret = QStringLiteral(\"");
              iVar33 = pEVar23->value;
              args = (name_00->values).d.ptr;
              lVar29 = (name_00->values).d.size;
              local_f8 = (undefined1  [8])0x0;
              uStack_f0 = (char *)0x0;
              local_e8 = 0;
              if (lVar29 != 0) {
                lVar29 = lVar29 << 5;
                do {
                  if (args->value == iVar33) {
                    QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                              ((QMovableArrayOps<QString> *)local_f8,local_e8,&args->name);
                    QList<QString>::end((QList<QString> *)local_f8);
                  }
                  args = args + 1;
                  lVar29 = lVar29 + -0x20;
                } while (lVar29 != 0);
              }
              local_138.d.d = (Data *)CONCAT62(local_138.d.d._2_6_,0x5f);
              QtPrivate::QStringList_join(&local_118,(QStringList *)local_f8,(QChar *)&local_138,1);
              QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_f8)
              ;
              pQVar14 = QTextStream::operator<<(pQVar14,&local_118);
              QTextStream::operator<<(pQVar14,"\"); break;\n");
              if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
                }
              }
              local_f8._0_4_ = pEVar23->value;
              QtPrivate::QPodArrayOps<int>::emplace<int&>
                        ((QPodArrayOps<int> *)&local_98,local_98.d.size,(int *)local_f8);
              QList<int>::end((QList<int> *)&local_98);
            }
LAB_00107826:
            pEVar23 = pEVar23 + 1;
          } while (pEVar23 != pEVar20);
        }
        QTextStream::operator<<(&local_178,"    }\n    return ret;\n}\n");
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
          }
        }
        name_00 = name_00 + 1;
      } while (name_00 != pTVar16);
    }
    lVar29 = (provider->flags).d.size;
    if (lVar29 != 0) {
      name = (provider->flags).d.ptr;
      pTVar17 = name + lVar29;
      do {
        pQVar14 = QTextStream::operator<<(&local_178,"inline QString trace_convert_");
        typeToTypeName((QString *)local_f8,&name->name);
        pQVar14 = QTextStream::operator<<(pQVar14,(QString *)local_f8);
        pQVar14 = QTextStream::operator<<(pQVar14,"(");
        pQVar14 = QTextStream::operator<<(pQVar14,&name->name);
        QTextStream::operator<<(pQVar14," val)\n");
        if (local_f8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_f8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
          }
        }
        QTextStream::operator<<(&local_178,"{\n    QString ret;\n");
        qVar30 = (name->values).d.size;
        if (qVar30 != 0) {
          pFVar24 = (name->values).d.ptr;
          lVar29 = 0;
LAB_00107951:
          if (*(int *)((long)&pFVar24->value + lVar29) != 0) goto code_r0x00107959;
          pQVar14 = QTextStream::operator<<
                              (&local_178,"    if (val == 0)\n        return QStringLiteral(\"");
          iVar33 = *(int *)((long)&pFVar24->value + lVar29);
          pFVar24 = (name->values).d.ptr;
          lVar29 = (name->values).d.size;
          local_f8 = (undefined1  [8])0x0;
          uStack_f0 = (char *)0x0;
          local_e8 = 0;
          if (lVar29 != 0) {
            lVar29 = lVar29 << 5;
            do {
              if (pFVar24->value == iVar33) {
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)local_f8,local_e8,&pFVar24->name);
                QList<QString>::end((QList<QString> *)local_f8);
              }
              pFVar24 = pFVar24 + 1;
              lVar29 = lVar29 + -0x20;
            } while (lVar29 != 0);
          }
          local_118.d.d = (Data *)CONCAT62(local_118.d.d._2_6_,0x5f);
          QtPrivate::QStringList_join(&local_98,(QStringList *)local_f8,(QChar *)&local_118,1);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_f8);
          pQVar14 = QTextStream::operator<<(pQVar14,&local_98);
          QTextStream::operator<<(pQVar14,"\");\n");
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          pFVar24 = (name->values).d.ptr;
          qVar30 = (name->values).d.size;
LAB_00107a74:
          local_f8 = (undefined1  [8])0x0;
          uStack_f0 = (char *)0x0;
          local_e8 = 0;
          if (qVar30 != 0) {
            pFVar31 = pFVar24 + qVar30;
            do {
              if (pFVar24->value != 0) {
                if (local_e8 != 0) {
                  lVar29 = 0;
                  do {
                    if (local_e8 << 2 == lVar29) goto LAB_00107ad8;
                    lVar21 = lVar29 + 4;
                    piVar1 = (int *)((long)&(((QString *)uStack_f0)->d).d + lVar29);
                    lVar29 = lVar21;
                  } while (*piVar1 != pFVar24->value);
                  if (lVar21 != 0) goto LAB_00107b4b;
                }
LAB_00107ad8:
                pQVar14 = QTextStream::operator<<(&local_178,"    if (val & ");
                pQVar14 = QTextStream::operator<<(pQVar14,1 << ((char)pFVar24->value - 1U & 0x1f));
                pQVar14 = QTextStream::operator<<
                                    (pQVar14,
                                     ") { if (ret.length()) ret += QLatin1Char(\'|\'); ret += QStringLiteral(\""
                                    );
                pQVar14 = QTextStream::operator<<(pQVar14,&pFVar24->name);
                QTextStream::operator<<(pQVar14,"\"); }\n");
                local_98.d.d = (Data *)CONCAT44(local_98.d.d._4_4_,pFVar24->value);
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)local_f8,local_e8,(int *)&local_98);
                QList<int>::end((QList<int> *)local_f8);
              }
LAB_00107b4b:
              pFVar24 = pFVar24 + 1;
            } while (pFVar24 != pFVar31);
          }
          goto LAB_00107b58;
        }
        local_f8 = (undefined1  [8])0x0;
        uStack_f0 = (char *)0x0;
        local_e8 = 0;
LAB_00107b58:
        QTextStream::operator<<(&local_178,"    return ret;\n}\n");
        if (local_f8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_f8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_f8,4,0x10);
          }
        }
        name = name + 1;
      } while (name != pTVar17);
    }
    lVar29 = (provider->tracepoints).d.size;
    if (lVar29 != 0) {
      string = (provider->tracepoints).d.ptr;
      pTVar2 = string + lVar29;
      do {
        local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        formatFunctionSignature(&local_98,&string->args);
        local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        formatParameterList(&local_118,provider,&string->args,&string->fields,ETW);
        local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_170.d.d = (Data *)0x0;
        local_170.d.ptr = L"TP_%1_%2";
        local_170.d.size = 8;
        a_00.m_size = (provider->name).d.size * 4 + 2;
        a_00.field_0.m_data_utf16 = (provider->name).d.ptr;
        QString::arg_impl(&local_158,&local_170,a_00,0,(QChar)0x20);
        a_01.m_size = (string->name).d.size * 4 + 2;
        a_01.field_0.m_data_utf16 = (string->name).d.ptr;
        QString::arg_impl((QString *)local_f8,&local_158,a_01,0,(QChar)0x20);
        QString::toUpper_helper(&local_138,(QString *)local_f8);
        if (local_f8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_f8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
          }
        }
        if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        uStack_f0 = "_provider";
        local_e8 = 9;
        local_f8 = (undefined1  [8])provider;
        QStringBuilder<const_QString_&,_QLatin1StringView>::convertTo<QString>
                  (&local_158,(QStringBuilder<const_QString_&,_QLatin1StringView> *)local_f8);
        QTextStream::operator<<(&local_178,"\n");
        pQVar14 = QTextStream::operator<<(&local_178,"inline void trace_");
        pQVar14 = QTextStream::operator<<(pQVar14,&string->name);
        pQVar14 = QTextStream::operator<<(pQVar14,"(");
        pQVar14 = QTextStream::operator<<(pQVar14,&local_98);
        pQVar14 = QTextStream::operator<<(pQVar14,")\n");
        QTextStream::operator<<(pQVar14,"{\n");
        lVar29 = (string->fields).d.size;
        if (lVar29 != 0) {
          pQVar32 = &((string->fields).d.ptr)->name;
          lVar29 = lVar29 * 0x58;
          do {
            if (*(int *)((long)(pQVar32 + -2) + 0x10) == 0x10) {
              pQVar14 = QTextStream::operator<<(&local_178,"    const QString ");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pQVar14 = QTextStream::operator<<(pQVar14,"Str = QDebug::toString(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              QTextStream::operator<<(pQVar14,");\n");
            }
            pQVar32 = (QString *)((long)(pQVar32 + 3) + 0x10);
            lVar29 = lVar29 + -0x58;
          } while (lVar29 != 0);
        }
        pQVar14 = QTextStream::operator<<(&local_178,"    TraceLoggingWrite(");
        pQVar14 = QTextStream::operator<<(pQVar14,&local_158);
        pQVar14 = QTextStream::operator<<(pQVar14,", \"");
        pQVar14 = QTextStream::operator<<(pQVar14,&string->name);
        QTextStream::operator<<(pQVar14,"\"");
        lVar29 = (string->fields).d.size;
        if (lVar29 != 0) {
          pFVar25 = (string->fields).d.ptr;
          pFVar18 = pFVar25 + lVar29;
          do {
            QTextStream::operator<<(&local_178,",\n");
            QTextStream::operator<<(&local_178,"        ");
            pQVar32 = &pFVar25->name;
            if (0 < pFVar25->arrayLen) {
              iVar33 = 0;
              do {
                pQVar14 = QTextStream::operator<<(&local_178,"TraceLoggingValue(");
                pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
                pQVar14 = QTextStream::operator<<(pQVar14,"[");
                pQVar14 = QTextStream::operator<<(pQVar14,iVar33);
                pQVar14 = QTextStream::operator<<(pQVar14,"], \"");
                pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
                pQVar14 = QTextStream::operator<<(pQVar14,"[");
                pQVar14 = QTextStream::operator<<(pQVar14,iVar33);
                QTextStream::operator<<(pQVar14,"]\")");
                iVar33 = iVar33 + 1;
                iVar13 = pFVar25->arrayLen;
                if (iVar33 < iVar13) {
                  QTextStream::operator<<(&local_178,",\n        ");
                  iVar13 = pFVar25->arrayLen;
                }
              } while (iVar33 < iVar13);
              goto LAB_00108249;
            }
            switch(pFVar25->backendType) {
            case Pointer:
              pcVar15 = "TraceLoggingPointer(";
              goto LAB_00108210;
            case QtString:
              pQVar14 = QTextStream::operator<<
                                  (&local_178,
                                   "TraceLoggingCountedWideString(reinterpret_cast<LPCWSTR>(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pQVar14 = QTextStream::operator<<(pQVar14,".utf16()), static_cast<ULONG>(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pcVar15 = ".size()), \"";
              break;
            case QtByteArray:
              pQVar14 = QTextStream::operator<<(&local_178,"TraceLoggingBinary(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pQVar14 = QTextStream::operator<<(pQVar14,".constData(), ");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pcVar15 = ".size(), \"";
              break;
            case QtUrl:
              pQVar14 = QTextStream::operator<<(&local_178,"TraceLoggingValue(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pcVar15 = ".toEncoded().constData(), \"";
              break;
            case QtRect:
            case QtRectF:
              pQVar14 = QTextStream::operator<<(&local_178,"TraceLoggingValue(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pQVar14 = QTextStream::operator<<(pQVar14,".x(), \"x\"), ");
              pQVar14 = QTextStream::operator<<(pQVar14,"TraceLoggingValue(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pQVar14 = QTextStream::operator<<(pQVar14,".y(), \"y\"), ");
              goto LAB_001080cc;
            case QtSize:
            case QtSizeF:
              pQVar14 = &local_178;
LAB_001080cc:
              pQVar14 = QTextStream::operator<<(pQVar14,"TraceLoggingValue(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pQVar14 = QTextStream::operator<<(pQVar14,".width(), \"width\"), ");
              pQVar14 = QTextStream::operator<<(pQVar14,"TraceLoggingValue(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pcVar15 = ".height(), \"height\")";
              goto LAB_00108244;
            case EnumeratedType:
            case FlagType:
              pQVar14 = QTextStream::operator<<(&local_178,"TraceLoggingString(trace_convert_");
              typeToTypeName((QString *)local_f8,&pFVar25->paramType);
              pQVar14 = QTextStream::operator<<(pQVar14,(QString *)local_f8);
              pQVar14 = QTextStream::operator<<(pQVar14,"(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pQVar14 = QTextStream::operator<<(pQVar14,").toUtf8().constData(), \"");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              QTextStream::operator<<(pQVar14,"\")");
              if (local_f8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_f8)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
                }
              }
              goto LAB_00108249;
            case Unknown:
              pQVar14 = QTextStream::operator<<
                                  (&local_178,
                                   "TraceLoggingCountedWideString(reinterpret_cast<LPCWSTR>(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pQVar14 = QTextStream::operator<<(pQVar14,"Str.utf16()), static_cast<ULONG>(");
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pcVar15 = "Str.size()), \"";
              break;
            default:
              pcVar15 = "TraceLoggingValue(";
LAB_00108210:
              pQVar14 = QTextStream::operator<<(&local_178,pcVar15);
              pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
              pcVar15 = ", \"";
            }
            pQVar14 = QTextStream::operator<<(pQVar14,pcVar15);
            pQVar14 = QTextStream::operator<<(pQVar14,pQVar32);
            pcVar15 = "\")";
LAB_00108244:
            QTextStream::operator<<(pQVar14,pcVar15);
LAB_00108249:
            pFVar25 = pFVar25 + 1;
          } while (pFVar25 != pFVar18);
        }
        pQVar14 = QTextStream::operator<<(&local_178,");\n");
        QTextStream::operator<<(pQVar14,"}\n\n");
        pQVar14 = QTextStream::operator<<(&local_178,"inline void do_trace_");
        pQVar14 = QTextStream::operator<<(pQVar14,&string->name);
        pQVar14 = QTextStream::operator<<(pQVar14,"(");
        pQVar14 = QTextStream::operator<<(pQVar14,&local_98);
        pQVar14 = QTextStream::operator<<(pQVar14,")\n");
        pQVar14 = QTextStream::operator<<(pQVar14,"{\n");
        pQVar14 = QTextStream::operator<<(pQVar14,"    trace_");
        pQVar14 = QTextStream::operator<<(pQVar14,&string->name);
        pQVar14 = QTextStream::operator<<(pQVar14,"(");
        pQVar14 = QTextStream::operator<<(pQVar14,&local_118);
        pQVar14 = QTextStream::operator<<(pQVar14,");\n");
        QTextStream::operator<<(pQVar14,"}\n");
        pQVar14 = QTextStream::operator<<(&local_178,"inline bool trace_");
        pQVar14 = QTextStream::operator<<(pQVar14,&string->name);
        pQVar14 = QTextStream::operator<<(pQVar14,"_enabled()\n");
        pQVar14 = QTextStream::operator<<(pQVar14,"{\n");
        pQVar14 = QTextStream::operator<<(pQVar14,"    return TraceLoggingProviderEnabled(");
        pQVar14 = QTextStream::operator<<(pQVar14,&local_158);
        pQVar14 = QTextStream::operator<<(pQVar14,", 0, 0);\n");
        QTextStream::operator<<(pQVar14,"}\n");
        if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        string = string + 1;
      } while (string != pTVar2);
    }
    pQVar14 = QTextStream::operator<<(&local_178,"} // namespace QtPrivate\n");
    pQVar14 = QTextStream::operator<<(pQVar14,"QT_END_NAMESPACE\n");
    pQVar14 = QTextStream::operator<<(pQVar14,"#endif // ");
    pQVar14 = QTextStream::operator<<(pQVar14,&local_58);
    QTextStream::operator<<(pQVar14,"\n\n");
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar14 = QTextStream::operator<<(&local_178,"\n#endif // ");
  includeGuard((QString *)local_f8,&local_198);
  pQVar14 = QTextStream::operator<<(pQVar14,(QString *)local_f8);
  pQVar14 = QTextStream::operator<<(pQVar14,"\n");
  QTextStream::operator<<(pQVar14,"#include <private/qtrace_p.h>\n");
  if (local_f8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_f8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
    }
  }
  piVar1 = (int *)CONCAT44(local_198.d.d._4_4_,local_198.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_198.d.d._4_4_,local_198.d.d._0_4_),2,0x10)
      ;
    }
  }
  QTextStream::~QTextStream(&local_178);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
code_r0x00107959:
  lVar29 = lVar29 + 0x20;
  if (qVar30 << 5 == lVar29) goto LAB_00107a74;
  goto LAB_00107951;
}

Assistant:

void writeEtw(QFile &file, const Provider &provider)
{
    QTextStream stream(&file);

    const QString fileName = QFileInfo(file.fileName()).fileName();

    writePrologue(stream, fileName, provider);
    writeTracepoints(stream, provider);
    writeEpilogue(stream, fileName);
}